

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# events.c
# Opt level: O1

void monitor_callback(GLFWmonitor *monitor,wchar_t event)

{
  uint uVar1;
  GLFWvidmode *pGVar2;
  char *pcVar3;
  double dVar4;
  wchar_t x;
  wchar_t heightMM;
  wchar_t widthMM;
  wchar_t y;
  
  uVar1 = counter;
  if (event == L'\x00040001') {
    pGVar2 = glfwGetVideoMode(monitor);
    glfwGetMonitorPos(monitor,&x,&y);
    glfwGetMonitorPhysicalSize(monitor,&widthMM,&heightMM);
    uVar1 = counter;
    counter = counter + 1;
    dVar4 = glfwGetTime();
    pcVar3 = glfwGetMonitorName(monitor);
    printf("%08x at %0.3f: Monitor %s (%ix%i at %ix%i, %ix%i mm) was connected\n",dVar4,(ulong)uVar1
           ,pcVar3,(ulong)(uint)pGVar2->width,(ulong)(uint)pGVar2->height,(ulong)(uint)x,
           (ulong)(uint)y,(ulong)(uint)widthMM,(ulong)(uint)heightMM);
    return;
  }
  counter = counter + 1;
  dVar4 = glfwGetTime();
  pcVar3 = glfwGetMonitorName(monitor);
  printf("%08x at %0.3f: Monitor %s was disconnected\n",dVar4,(ulong)uVar1,pcVar3);
  return;
}

Assistant:

void monitor_callback(GLFWmonitor* monitor, int event)
{
    if (event == GLFW_CONNECTED)
    {
        int x, y, widthMM, heightMM;
        const GLFWvidmode* mode = glfwGetVideoMode(monitor);

        glfwGetMonitorPos(monitor, &x, &y);
        glfwGetMonitorPhysicalSize(monitor, &widthMM, &heightMM);

        printf("%08x at %0.3f: Monitor %s (%ix%i at %ix%i, %ix%i mm) was connected\n",
               counter++,
               glfwGetTime(),
               glfwGetMonitorName(monitor),
               mode->width, mode->height,
               x, y,
               widthMM, heightMM);
    }
    else
    {
        printf("%08x at %0.3f: Monitor %s was disconnected\n",
               counter++,
               glfwGetTime(),
               glfwGetMonitorName(monitor));
    }
}